

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int lockBtree(BtShared *pBt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  int iVar7;
  u32 uVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  int local_4c;
  u8 *puStack_48;
  int isOpen;
  u8 *page1;
  uint local_38;
  u32 usableSize;
  u32 pageSize;
  u32 nPageHeader;
  u32 nPageFile;
  u32 nPage;
  MemPage *pPage1;
  BtShared *pBStack_18;
  int rc;
  BtShared *pBt_local;
  
  pageSize = 0;
  pBStack_18 = pBt;
  pPage1._4_4_ = sqlite3PagerSharedLock(pBt->pPager);
  if (pPage1._4_4_ != 0) {
    return pPage1._4_4_;
  }
  pPage1._4_4_ = btreeGetPage(pBStack_18,1,(MemPage **)&nPageFile,0);
  if (pPage1._4_4_ != 0) {
    return pPage1._4_4_;
  }
  usableSize = sqlite3Get4byte(_nPageFile->aData + 0x1c);
  nPageHeader = usableSize;
  sqlite3PagerPagecount(pBStack_18->pPager,(int *)&pageSize);
  if ((nPageHeader == 0) ||
     (*(int *)(_nPageFile->aData + 0x18) != *(int *)(_nPageFile->aData + 0x5c))) {
    nPageHeader = pageSize;
  }
  if ((pBStack_18->db->flags & 0x2000000) != 0) {
    nPageHeader = 0;
  }
  if (nPageHeader == 0) {
LAB_0014934a:
    pBStack_18->maxLocal = (short)((ulong)((pBStack_18->usableSize - 0xc) * 0x40) / 0xff) - 0x17;
    pBStack_18->minLocal = (short)((ulong)((pBStack_18->usableSize - 0xc) * 0x20) / 0xff) - 0x17;
    pBStack_18->maxLeaf = (short)pBStack_18->usableSize - 0x23;
    pBStack_18->minLeaf = (short)((ulong)((pBStack_18->usableSize - 0xc) * 0x20) / 0xff) - 0x17;
    if (pBStack_18->maxLocal < 0x80) {
      pBStack_18->max1bytePayload = (u8)pBStack_18->maxLocal;
    }
    else {
      pBStack_18->max1bytePayload = '\x7f';
    }
    pBStack_18->pPage1 = _nPageFile;
    pBStack_18->nPage = nPageHeader;
    pBt_local._4_4_ = 0;
  }
  else {
    puStack_48 = _nPageFile->aData;
    pPage1._4_4_ = 0x1a;
    cVar9 = -(puStack_48[2] == 'L');
    cVar10 = -(puStack_48[3] == 'i');
    cVar11 = -(puStack_48[4] == 't');
    cVar12 = -(puStack_48[5] == 'e');
    cVar13 = -(puStack_48[6] == ' ');
    cVar14 = -(puStack_48[7] == 'f');
    cVar15 = -(puStack_48[8] == 'o');
    cVar16 = -(puStack_48[9] == 'r');
    cVar17 = -(puStack_48[10] == 'm');
    cVar18 = -(puStack_48[0xb] == 'a');
    cVar19 = -(puStack_48[0xc] == 't');
    cVar20 = -(puStack_48[0xd] == ' ');
    cVar21 = -(puStack_48[0xe] == '3');
    bVar22 = -(puStack_48[0xf] == '\0');
    auVar1[1] = -(puStack_48[1] == 'Q');
    auVar1[0] = -(*puStack_48 == 'S');
    auVar1[2] = cVar9;
    auVar1[3] = cVar10;
    auVar1[4] = cVar11;
    auVar1[5] = cVar12;
    auVar1[6] = cVar13;
    auVar1[7] = cVar14;
    auVar1[8] = cVar15;
    auVar1[9] = cVar16;
    auVar1[10] = cVar17;
    auVar1[0xb] = cVar18;
    auVar1[0xc] = cVar19;
    auVar1[0xd] = cVar20;
    auVar1[0xe] = cVar21;
    auVar1[0xf] = bVar22;
    auVar2[1] = -(puStack_48[1] == 'Q');
    auVar2[0] = -(*puStack_48 == 'S');
    auVar2[2] = cVar9;
    auVar2[3] = cVar10;
    auVar2[4] = cVar11;
    auVar2[5] = cVar12;
    auVar2[6] = cVar13;
    auVar2[7] = cVar14;
    auVar2[8] = cVar15;
    auVar2[9] = cVar16;
    auVar2[10] = cVar17;
    auVar2[0xb] = cVar18;
    auVar2[0xc] = cVar19;
    auVar2[0xd] = cVar20;
    auVar2[0xe] = cVar21;
    auVar2[0xf] = bVar22;
    auVar6[1] = cVar10;
    auVar6[0] = cVar9;
    auVar6[2] = cVar11;
    auVar6[3] = cVar12;
    auVar6[4] = cVar13;
    auVar6[5] = cVar14;
    auVar6[6] = cVar15;
    auVar6[7] = cVar16;
    auVar6[8] = cVar17;
    auVar6[9] = cVar18;
    auVar6[10] = cVar19;
    auVar6[0xb] = cVar20;
    auVar6[0xc] = cVar21;
    auVar6[0xd] = bVar22;
    auVar5[1] = cVar11;
    auVar5[0] = cVar10;
    auVar5[2] = cVar12;
    auVar5[3] = cVar13;
    auVar5[4] = cVar14;
    auVar5[5] = cVar15;
    auVar5[6] = cVar16;
    auVar5[7] = cVar17;
    auVar5[8] = cVar18;
    auVar5[9] = cVar19;
    auVar5[10] = cVar20;
    auVar5[0xb] = cVar21;
    auVar5[0xc] = bVar22;
    auVar4[1] = cVar12;
    auVar4[0] = cVar11;
    auVar4[2] = cVar13;
    auVar4[3] = cVar14;
    auVar4[4] = cVar15;
    auVar4[5] = cVar16;
    auVar4[6] = cVar17;
    auVar4[7] = cVar18;
    auVar4[8] = cVar19;
    auVar4[9] = cVar20;
    auVar4[10] = cVar21;
    auVar4[0xb] = bVar22;
    auVar3[1] = cVar13;
    auVar3[0] = cVar12;
    auVar3[2] = cVar14;
    auVar3[3] = cVar15;
    auVar3[4] = cVar16;
    auVar3[5] = cVar17;
    auVar3[6] = cVar18;
    auVar3[7] = cVar19;
    auVar3[8] = cVar20;
    auVar3[9] = cVar21;
    auVar3[10] = bVar22;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar22,CONCAT18(cVar21,CONCAT17(cVar20,CONCAT16(cVar19,
                                                  CONCAT15(cVar18,CONCAT14(cVar17,CONCAT13(cVar16,
                                                  CONCAT12(cVar15,CONCAT11(cVar14,cVar13))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar22,CONCAT17(cVar21,CONCAT16(cVar20,CONCAT15(cVar19,
                                                  CONCAT14(cVar18,CONCAT13(cVar17,CONCAT12(cVar16,
                                                  CONCAT11(cVar15,cVar14)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar22 >> 7) << 0xf) == 0xffff) {
      if (2 < puStack_48[0x12]) {
        pBStack_18->btsFlags = pBStack_18->btsFlags | 1;
      }
      if (puStack_48[0x13] < 3) {
        if ((puStack_48[0x13] == '\x02') && ((pBStack_18->btsFlags & 0x20) == 0)) {
          local_4c = 0;
          pPage1._4_4_ = sqlite3PagerOpenWal(pBStack_18->pPager,&local_4c);
          if (pPage1._4_4_ != 0) goto LAB_00149412;
          if (local_4c == 0) {
            releasePageOne(_nPageFile);
            return 0;
          }
        }
        pPage1._4_4_ = 0x1a;
        iVar7 = memcmp(puStack_48 + 0x15,"@  ",3);
        if ((((iVar7 == 0) &&
             (local_38 = (uint)puStack_48[0x10] << 8 | (uint)puStack_48[0x11] << 0x10,
             (local_38 - 1 & local_38) == 0)) && (local_38 < 0x10001)) && (0x100 < local_38)) {
          pBStack_18->btsFlags = pBStack_18->btsFlags | 2;
          page1._4_4_ = local_38 - puStack_48[0x14];
          if (local_38 != pBStack_18->pageSize) {
            releasePageOne(_nPageFile);
            pBStack_18->usableSize = page1._4_4_;
            pBStack_18->pageSize = local_38;
            freeTempSpace(pBStack_18);
            iVar7 = sqlite3PagerSetPagesize
                              (pBStack_18->pPager,&pBStack_18->pageSize,local_38 - page1._4_4_);
            return iVar7;
          }
          iVar7 = sqlite3WritableSchema(pBStack_18->db);
          if ((iVar7 == 0) && (pageSize < nPageHeader)) {
            pPage1._4_4_ = sqlite3CorruptError(0x1033d);
          }
          else if (0x1df < page1._4_4_) {
            pBStack_18->pageSize = local_38;
            pBStack_18->usableSize = page1._4_4_;
            uVar8 = sqlite3Get4byte(puStack_48 + 0x34);
            pBStack_18->autoVacuum = uVar8 != 0;
            uVar8 = sqlite3Get4byte(puStack_48 + 0x40);
            pBStack_18->incrVacuum = uVar8 != 0;
            goto LAB_0014934a;
          }
        }
      }
    }
LAB_00149412:
    releasePageOne(_nPageFile);
    pBStack_18->pPage1 = (MemPage *)0x0;
    pBt_local._4_4_ = pPage1._4_4_;
  }
  return pBt_local._4_4_;
}

Assistant:

static int lockBtree(BtShared *pBt){
  int rc;              /* Result code from subfunctions */
  MemPage *pPage1;     /* Page 1 of the database file */
  u32 nPage;           /* Number of pages in the database */
  u32 nPageFile = 0;   /* Number of pages in the database file */
  u32 nPageHeader;     /* Number of pages in the database according to hdr */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pBt->pPage1==0 );
  rc = sqlite3PagerSharedLock(pBt->pPager);
  if( rc!=SQLITE_OK ) return rc;
  rc = btreeGetPage(pBt, 1, &pPage1, 0);
  if( rc!=SQLITE_OK ) return rc;

  /* Do some checking to help insure the file we opened really is
  ** a valid database file. 
  */
  nPage = nPageHeader = get4byte(28+(u8*)pPage1->aData);
  sqlite3PagerPagecount(pBt->pPager, (int*)&nPageFile);
  if( nPage==0 || memcmp(24+(u8*)pPage1->aData, 92+(u8*)pPage1->aData,4)!=0 ){
    nPage = nPageFile;
  }
  if( (pBt->db->flags & SQLITE_ResetDatabase)!=0 ){
    nPage = 0;
  }
  if( nPage>0 ){
    u32 pageSize;
    u32 usableSize;
    u8 *page1 = pPage1->aData;
    rc = SQLITE_NOTADB;
    /* EVIDENCE-OF: R-43737-39999 Every valid SQLite database file begins
    ** with the following 16 bytes (in hex): 53 51 4c 69 74 65 20 66 6f 72 6d
    ** 61 74 20 33 00. */
    if( memcmp(page1, zMagicHeader, 16)!=0 ){
      goto page1_init_failed;
    }

#ifdef SQLITE_OMIT_WAL
    if( page1[18]>1 ){
      pBt->btsFlags |= BTS_READ_ONLY;
    }
    if( page1[19]>1 ){
      goto page1_init_failed;
    }
#else
    if( page1[18]>2 ){
      pBt->btsFlags |= BTS_READ_ONLY;
    }
    if( page1[19]>2 ){
      goto page1_init_failed;
    }

    /* If the write version is set to 2, this database should be accessed
    ** in WAL mode. If the log is not already open, open it now. Then 
    ** return SQLITE_OK and return without populating BtShared.pPage1.
    ** The caller detects this and calls this function again. This is
    ** required as the version of page 1 currently in the page1 buffer
    ** may not be the latest version - there may be a newer one in the log
    ** file.
    */
    if( page1[19]==2 && (pBt->btsFlags & BTS_NO_WAL)==0 ){
      int isOpen = 0;
      rc = sqlite3PagerOpenWal(pBt->pPager, &isOpen);
      if( rc!=SQLITE_OK ){
        goto page1_init_failed;
      }else{
        setDefaultSyncFlag(pBt, SQLITE_DEFAULT_WAL_SYNCHRONOUS+1);
        if( isOpen==0 ){
          releasePageOne(pPage1);
          return SQLITE_OK;
        }
      }
      rc = SQLITE_NOTADB;
    }else{
      setDefaultSyncFlag(pBt, SQLITE_DEFAULT_SYNCHRONOUS+1);
    }
#endif

    /* EVIDENCE-OF: R-15465-20813 The maximum and minimum embedded payload
    ** fractions and the leaf payload fraction values must be 64, 32, and 32.
    **
    ** The original design allowed these amounts to vary, but as of
    ** version 3.6.0, we require them to be fixed.
    */
    if( memcmp(&page1[21], "\100\040\040",3)!=0 ){
      goto page1_init_failed;
    }
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pageSize = (page1[16]<<8) | (page1[17]<<16);
    /* EVIDENCE-OF: R-25008-21688 The size of a page is a power of two
    ** between 512 and 65536 inclusive. */
    if( ((pageSize-1)&pageSize)!=0
     || pageSize>SQLITE_MAX_PAGE_SIZE 
     || pageSize<=256 
    ){
      goto page1_init_failed;
    }
    pBt->btsFlags |= BTS_PAGESIZE_FIXED;
    assert( (pageSize & 7)==0 );
    /* EVIDENCE-OF: R-59310-51205 The "reserved space" size in the 1-byte
    ** integer at offset 20 is the number of bytes of space at the end of
    ** each page to reserve for extensions. 
    **
    ** EVIDENCE-OF: R-37497-42412 The size of the reserved region is
    ** determined by the one-byte unsigned integer found at an offset of 20
    ** into the database file header. */
    usableSize = pageSize - page1[20];
    if( (u32)pageSize!=pBt->pageSize ){
      /* After reading the first page of the database assuming a page size
      ** of BtShared.pageSize, we have discovered that the page-size is
      ** actually pageSize. Unlock the database, leave pBt->pPage1 at
      ** zero and return SQLITE_OK. The caller will call this function
      ** again with the correct page-size.
      */
      releasePageOne(pPage1);
      pBt->usableSize = usableSize;
      pBt->pageSize = pageSize;
      freeTempSpace(pBt);
      rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize,
                                   pageSize-usableSize);
      return rc;
    }
    if( sqlite3WritableSchema(pBt->db)==0 && nPage>nPageFile ){
      rc = SQLITE_CORRUPT_BKPT;
      goto page1_init_failed;
    }
    /* EVIDENCE-OF: R-28312-64704 However, the usable size is not allowed to
    ** be less than 480. In other words, if the page size is 512, then the
    ** reserved space size cannot exceed 32. */
    if( usableSize<480 ){
      goto page1_init_failed;
    }
    pBt->pageSize = pageSize;
    pBt->usableSize = usableSize;
#ifndef SQLITE_OMIT_AUTOVACUUM
    pBt->autoVacuum = (get4byte(&page1[36 + 4*4])?1:0);
    pBt->incrVacuum = (get4byte(&page1[36 + 7*4])?1:0);
#endif
  }

  /* maxLocal is the maximum amount of payload to store locally for
  ** a cell.  Make sure it is small enough so that at least minFanout
  ** cells can will fit on one page.  We assume a 10-byte page header.
  ** Besides the payload, the cell must store:
  **     2-byte pointer to the cell
  **     4-byte child pointer
  **     9-byte nKey value
  **     4-byte nData value
  **     4-byte overflow page pointer
  ** So a cell consists of a 2-byte pointer, a header which is as much as
  ** 17 bytes long, 0 to N bytes of payload, and an optional 4 byte overflow
  ** page pointer.
  */
  pBt->maxLocal = (u16)((pBt->usableSize-12)*64/255 - 23);
  pBt->minLocal = (u16)((pBt->usableSize-12)*32/255 - 23);
  pBt->maxLeaf = (u16)(pBt->usableSize - 35);
  pBt->minLeaf = (u16)((pBt->usableSize-12)*32/255 - 23);
  if( pBt->maxLocal>127 ){
    pBt->max1bytePayload = 127;
  }else{
    pBt->max1bytePayload = (u8)pBt->maxLocal;
  }
  assert( pBt->maxLeaf + 23 <= MX_CELL_SIZE(pBt) );
  pBt->pPage1 = pPage1;
  pBt->nPage = nPage;
  return SQLITE_OK;

page1_init_failed:
  releasePageOne(pPage1);
  pBt->pPage1 = 0;
  return rc;
}